

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall xatlas::internal::param::Quality::computeMetrics(Quality *this,Mesh *mesh)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float *pfVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  Vector2 texcoord [3];
  Vector3 pos [3];
  float local_98 [4];
  float local_88;
  float local_84;
  float local_78;
  float fStack_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  undefined1 local_48 [16];
  
  this->totalParametricArea = 0.0;
  this->totalGeometricArea = 0.0;
  this->stretchMetric = 0.0;
  this->maxStretchMetric = 0.0;
  this->conformalMetric = 0.0;
  this->authalicMetric = 0.0;
  uVar1 = (mesh->m_indices).m_base.size;
  if (2 < uVar1) {
    lVar12 = 0;
    uVar13 = 0;
    do {
      uVar2 = (mesh->m_indices).m_base.size;
      lVar10 = 0;
      pfVar8 = &local_78;
      do {
        if (uVar2 <= (uint)(lVar12 + lVar10)) {
          pcVar9 = 
          "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]"
          ;
LAB_00127907:
          __assert_fail("index < m_base.size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                        ,0x478,pcVar9);
        }
        puVar4 = (mesh->m_indices).m_base.buffer;
        if (puVar4 == (uint8_t *)0x0) {
          pcVar9 = 
          "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]"
          ;
LAB_001278ba:
          __assert_fail("m_base.buffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                        ,0x479,pcVar9);
        }
        uVar3 = *(uint *)(puVar4 + (lVar12 + lVar10 & 0xffffffffU) * 4);
        uVar11 = (ulong)uVar3;
        if ((mesh->m_positions).m_base.size <= uVar3) {
          pcVar9 = 
          "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
          ;
          goto LAB_00127907;
        }
        puVar4 = (mesh->m_positions).m_base.buffer;
        if (puVar4 == (uint8_t *)0x0) {
          pcVar9 = 
          "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
          ;
          goto LAB_001278ba;
        }
        pfVar8[2] = *(float *)(puVar4 + uVar11 * 0xc + 8);
        *(undefined8 *)pfVar8 = *(undefined8 *)(puVar4 + uVar11 * 0xc);
        fVar7 = local_58;
        fVar6 = local_5c;
        fVar5 = local_60;
        fVar15 = local_64;
        fVar21 = local_68;
        fVar28 = local_6c;
        fVar24 = local_70;
        fVar20 = fStack_74;
        fVar27 = local_78;
        if ((mesh->m_texcoords).m_base.size <= uVar3) {
          pcVar9 = 
          "const T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) const [T = xatlas::internal::Vector2]"
          ;
          goto LAB_00127907;
        }
        puVar4 = (mesh->m_texcoords).m_base.buffer;
        if (puVar4 == (uint8_t *)0x0) {
          pcVar9 = 
          "const T &xatlas::internal::Array<xatlas::internal::Vector2>::operator[](uint32_t) const [T = xatlas::internal::Vector2]"
          ;
          goto LAB_001278ba;
        }
        *(undefined8 *)(local_98 + lVar10 * 2) = *(undefined8 *)(puVar4 + uVar11 * 8);
        fVar30 = local_84;
        fVar19 = local_88;
        fVar17 = local_98[3];
        fVar29 = local_98[2];
        fVar26 = local_98[1];
        fVar23 = local_98[0];
        lVar10 = lVar10 + 1;
        pfVar8 = pfVar8 + 3;
      } while (lVar10 != 3);
      fVar25 = local_98[3] - local_98[1];
      fVar22 = local_88 - local_98[0];
      fVar14 = (fVar25 * fVar22 - (local_98[2] - local_98[0]) * (local_84 - local_98[1])) * 0.5;
      if (1.1920929e-07 < ABS(fVar14)) {
        local_48 = ZEXT416(~-(uint)(fVar14 < 0.0) & (uint)fVar14 |
                           (uint)ABS(fVar14) & -(uint)(fVar14 < 0.0));
        fVar18 = (local_68 - fStack_74) * (local_58 - local_70) -
                 (local_5c - fStack_74) * (local_64 - local_70);
        fVar16 = (local_64 - local_70) * (local_60 - local_78) -
                 (local_58 - local_70) * (local_6c - local_78);
        fVar14 = (local_5c - fStack_74) * (local_6c - local_78) -
                 (local_60 - local_78) * (local_68 - fStack_74);
        fVar14 = fVar14 * fVar14 + fVar18 * fVar18 + fVar16 * fVar16;
        if (fVar14 < 0.0) {
          fVar14 = sqrtf(fVar14);
        }
        else {
          fVar14 = SQRT(fVar14);
        }
        fVar23 = fVar23 - fVar29;
        fVar29 = fVar29 - fVar19;
        fVar19 = 1.0 / ((float)local_48._0_4_ + (float)local_48._0_4_);
        fVar26 = fVar26 - fVar30;
        fVar30 = fVar30 - fVar17;
        fVar16 = (fVar23 * fVar5 + fVar22 * fVar28 + fVar29 * fVar27) * fVar19;
        fVar17 = (fVar23 * fVar6 + fVar22 * fVar21 + fVar29 * fVar20) * fVar19;
        fVar23 = (fVar23 * fVar7 + fVar22 * fVar15 + fVar29 * fVar24) * fVar19;
        fVar27 = (fVar5 * fVar25 + fVar28 * fVar26 + fVar27 * fVar30) * fVar19;
        fVar28 = (fVar6 * fVar25 + fVar21 * fVar26 + fVar20 * fVar30) * fVar19;
        fVar19 = (fVar25 * fVar7 + fVar26 * fVar15 + fVar30 * fVar24) * fVar19;
        fVar20 = fVar23 * fVar23 + fVar16 * fVar16 + fVar17 * fVar17;
        fVar24 = fVar23 * fVar19 + fVar16 * fVar27 + fVar17 * fVar28;
        fVar28 = fVar19 * fVar19 + fVar27 * fVar27 + fVar28 * fVar28;
        fVar27 = fVar20 - fVar28;
        fVar27 = fVar24 * fVar24 * 4.0 + fVar27 * fVar27;
        fVar14 = fVar14 * 0.5;
        if (fVar27 < 0.0) {
          fVar24 = sqrtf(fVar27);
        }
        else {
          fVar24 = SQRT(fVar27);
        }
        fVar20 = fVar20 + fVar28;
        fVar28 = 0.0;
        if (0.0 <= fVar20 - fVar24) {
          fVar28 = fVar20 - fVar24;
        }
        fVar28 = fVar28 * 0.5;
        if (fVar28 < 0.0) {
          fVar28 = sqrtf(fVar28);
        }
        else {
          fVar28 = SQRT(fVar28);
        }
        if (fVar27 < 0.0) {
          fVar27 = sqrtf(fVar27);
        }
        else {
          fVar27 = SQRT(fVar27);
        }
        fVar24 = 0.0;
        if (0.0 <= fVar27 + fVar20) {
          fVar24 = fVar27 + fVar20;
        }
        fVar24 = fVar24 * 0.5;
        if (fVar24 < 0.0) {
          fVar24 = sqrtf(fVar24);
        }
        else {
          fVar24 = SQRT(fVar24);
        }
        if (fVar24 <= fVar28) {
          fVar27 = ABS(fVar28);
          if (ABS(fVar28) <= ABS(fVar24)) {
            fVar27 = ABS(fVar24);
          }
          fVar21 = 1.0;
          if (1.0 <= fVar27) {
            fVar21 = fVar27;
          }
          if (s_print != (undefined *)0x0 && fVar21 * 0.0001 < ABS(fVar28 - fVar24)) {
            (*(code *)s_print)("\rASSERT: %s %s %d\n",
                               "sigma2 > sigma1 || equal(sigma1, sigma2, kEpsilon)",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                               ,0x1bb8);
          }
        }
        fVar20 = fVar20 * 0.5;
        if (fVar20 < 0.0) {
          fVar20 = sqrtf(fVar20);
        }
        else {
          fVar20 = SQRT(fVar20);
        }
        fVar27 = (fVar24 * fVar24 + fVar28 * fVar28) * 0.5;
        if (fVar27 < 0.0) {
          fVar27 = sqrtf(fVar27);
        }
        else {
          fVar27 = SQRT(fVar27);
        }
        fVar21 = ABS(fVar20);
        if (ABS(fVar20) <= ABS(fVar27)) {
          fVar21 = ABS(fVar27);
        }
        fVar15 = 1.0;
        if (1.0 <= fVar21) {
          fVar15 = fVar21;
        }
        if (fVar15 * 0.01 < ABS(fVar20 - fVar27)) {
          __assert_fail("equal(rmsStretch, rmsStretch2, 0.01f)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                        ,0x1bbe,
                        "void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
        }
        this->stretchMetric = fVar20 * fVar20 * fVar14 + this->stretchMetric;
        fVar27 = this->maxStretchMetric;
        if (this->maxStretchMetric <= fVar24) {
          fVar27 = fVar24;
        }
        this->maxStretchMetric = fVar27;
        if (1e-06 < ABS(fVar28)) {
          this->conformalMetric = (fVar24 / fVar28) * fVar14 + this->conformalMetric;
        }
        this->authalicMetric = fVar28 * fVar24 * fVar14 + this->authalicMetric;
        this->totalGeometricArea = fVar14 + this->totalGeometricArea;
        this->totalParametricArea = (float)local_48._0_4_ + this->totalParametricArea;
      }
      uVar13 = uVar13 + 1;
      lVar12 = lVar12 + 3;
    } while (uVar13 != uVar1 / 3);
  }
  fVar27 = this->totalParametricArea;
  if ((fVar27 < 0.0) || (((uint)fVar27 & 0xfffffffe) == 0x7f800000)) {
    __assert_fail("isFinite(totalParametricArea) && totalParametricArea >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcb,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  fVar20 = this->totalGeometricArea;
  if ((fVar20 < 0.0) || (((uint)fVar20 & 0xfffffffe) == 0x7f800000)) {
    __assert_fail("isFinite(totalGeometricArea) && totalGeometricArea >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcc,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if (0xfffffffd < (int)this->stretchMetric + 0x807ffffeU) {
    __assert_fail("isFinite(stretchMetric)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcd,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if (0xfffffffd < (int)this->maxStretchMetric + 0x807ffffeU) {
    __assert_fail("isFinite(maxStretchMetric)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bce,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if (0xfffffffd < (int)this->conformalMetric + 0x807ffffeU) {
    __assert_fail("isFinite(conformalMetric)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcf,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  if ((int)this->authalicMetric + 0x807ffffeU < 0xfffffffe) {
    if (0.0 < fVar20) {
      fVar27 = fVar27 / fVar20;
      if (fVar27 < 0.0) {
        fVar27 = sqrtf(fVar27);
      }
      else {
        fVar27 = SQRT(fVar27);
      }
      fVar20 = this->stretchMetric / this->totalGeometricArea;
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      this->stretchMetric = fVar20 * fVar27;
      this->maxStretchMetric = fVar27 * this->maxStretchMetric;
      fVar27 = this->conformalMetric / this->totalGeometricArea;
      if (fVar27 < 0.0) {
        fVar27 = sqrtf(fVar27);
      }
      else {
        fVar27 = SQRT(fVar27);
      }
      this->conformalMetric = fVar27;
      fVar27 = this->authalicMetric / this->totalGeometricArea;
      if (fVar27 < 0.0) {
        fVar27 = sqrtf(fVar27);
      }
      else {
        fVar27 = SQRT(fVar27);
      }
      this->authalicMetric = fVar27;
    }
    return;
  }
  __assert_fail("isFinite(authalicMetric)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x1bd0,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
}

Assistant:

void computeMetrics(const Mesh *mesh)
	{
		totalGeometricArea = totalParametricArea = 0.0f;
		stretchMetric = maxStretchMetric = conformalMetric = authalicMetric = 0.0f;
		const uint32_t faceCount = mesh->faceCount();
		for (uint32_t f = 0; f < faceCount; f++) {
			Vector3 pos[3];
			Vector2 texcoord[3];
			for (int i = 0; i < 3; i++) {
				const uint32_t v = mesh->vertexAt(f * 3 + i);
				pos[i] = mesh->position(v);
				texcoord[i] = mesh->texcoord(v);
			}
			// Evaluate texture stretch metric. See:
			// - "Texture Mapping Progressive Meshes", Sander, Snyder, Gortler & Hoppe
			// - "Mesh Parameterization: Theory and Practice", Siggraph'07 Course Notes, Hormann, Levy & Sheffer.
			const float t1 = texcoord[0].x;
			const float s1 = texcoord[0].y;
			const float t2 = texcoord[1].x;
			const float s2 = texcoord[1].y;
			const float t3 = texcoord[2].x;
			const float s3 = texcoord[2].y;
			float parametricArea = ((s2 - s1) * (t3 - t1) - (s3 - s1) * (t2 - t1)) * 0.5f;
			if (isZero(parametricArea, kAreaEpsilon))
				continue;
			if (parametricArea < 0.0f)
				parametricArea = fabsf(parametricArea);
			const float geometricArea = length(cross(pos[1] - pos[0], pos[2] - pos[0])) / 2;
			const Vector3 Ss = (pos[0] * (t2 - t3) + pos[1] * (t3 - t1) + pos[2] * (t1 - t2)) / (2 * parametricArea);
			const Vector3 St = (pos[0] * (s3 - s2) + pos[1] * (s1 - s3) + pos[2] * (s2 - s1)) / (2 * parametricArea);
			const float a = dot(Ss, Ss); // E
			const float b = dot(Ss, St); // F
			const float c = dot(St, St); // G
										 // Compute eigen-values of the first fundamental form:
			const float sigma1 = sqrtf(0.5f * max(0.0f, a + c - sqrtf(square(a - c) + 4 * square(b)))); // gamma uppercase, min eigenvalue.
			const float sigma2 = sqrtf(0.5f * max(0.0f, a + c + sqrtf(square(a - c) + 4 * square(b)))); // gamma lowercase, max eigenvalue.
			XA_ASSERT(sigma2 > sigma1 || equal(sigma1, sigma2, kEpsilon));
			// isometric: sigma1 = sigma2 = 1
			// conformal: sigma1 / sigma2 = 1
			// authalic: sigma1 * sigma2 = 1
			const float rmsStretch = sqrtf((a + c) * 0.5f);
			const float rmsStretch2 = sqrtf((square(sigma1) + square(sigma2)) * 0.5f);
			XA_DEBUG_ASSERT(equal(rmsStretch, rmsStretch2, 0.01f));
			XA_UNUSED(rmsStretch2);
			stretchMetric += square(rmsStretch) * geometricArea;
			maxStretchMetric = max(maxStretchMetric, sigma2);
			if (!isZero(sigma1, 0.000001f)) {
				// sigma1 is zero when geometricArea is zero.
				conformalMetric += (sigma2 / sigma1) * geometricArea;
			}
			authalicMetric += (sigma1 * sigma2) * geometricArea;
			// Accumulate total areas.
			totalGeometricArea += geometricArea;
			totalParametricArea += parametricArea;
		}
		XA_DEBUG_ASSERT(isFinite(totalParametricArea) && totalParametricArea >= 0);
		XA_DEBUG_ASSERT(isFinite(totalGeometricArea) && totalGeometricArea >= 0);
		XA_DEBUG_ASSERT(isFinite(stretchMetric));
		XA_DEBUG_ASSERT(isFinite(maxStretchMetric));
		XA_DEBUG_ASSERT(isFinite(conformalMetric));
		XA_DEBUG_ASSERT(isFinite(authalicMetric));
		if (totalGeometricArea > 0.0f) {
			const float normFactor = sqrtf(totalParametricArea / totalGeometricArea);
			stretchMetric = sqrtf(stretchMetric / totalGeometricArea) * normFactor;
			maxStretchMetric  *= normFactor;
			conformalMetric = sqrtf(conformalMetric / totalGeometricArea);
			authalicMetric = sqrtf(authalicMetric / totalGeometricArea);
		}
	}